

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-sys-linux.c
# Opt level: O0

int get_physical_package_id(uint32_t cpu,uint32_t *pkg)

{
  int iVar1;
  int iVar2;
  FILE *pFVar3;
  int *piVar4;
  char *pcVar5;
  int fret;
  FILE *f;
  char fname [92];
  uint32_t *pkg_local;
  uint32_t cpu_local;
  
  unique0x100001f1 = pkg;
  memset(&f,0,0x5c);
  snprintf((char *)&f,0x5c,"/sys/devices/system/cpu/cpu%u/topology/physical_package_id",(ulong)cpu);
  pFVar3 = fopen((char *)&f,"r");
  if (pFVar3 == (FILE *)0x0) {
    fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap-msr");
    pFVar3 = _stderr;
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    fprintf(pFVar3,"%s: %s\n",&f,pcVar5);
    pkg_local._4_4_ = -1;
  }
  else {
    iVar1 = __isoc99_fscanf(pFVar3,"%u",stack0xffffffffffffffe8);
    iVar2 = fclose(pFVar3);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s [%s] ","[WARN] ","raplcap-msr");
      pFVar3 = _stderr;
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(pFVar3,"%s: %s\n","get_physical_package_id: fclose",pcVar5);
    }
    if (iVar1 == 1) {
      pkg_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap-msr");
      fprintf(_stderr,"get_physical_package_id: Failed to read physical_package_id for cpu%u\n",
              (ulong)cpu);
      piVar4 = __errno_location();
      *piVar4 = 0x3d;
      pkg_local._4_4_ = -1;
    }
  }
  return pkg_local._4_4_;
}

Assistant:

static int get_physical_package_id(uint32_t cpu, uint32_t* pkg) {
  char fname[92] = { 0 };
  FILE* f;
  int fret;
  snprintf(fname, sizeof(fname), "/sys/devices/system/cpu/cpu%"PRIu32"/topology/physical_package_id", cpu);
  if ((f = fopen(fname, "r")) == NULL) {
    raplcap_perror(ERROR, fname);
    return -1;
  }
  fret = fscanf(f, "%"PRIu32, pkg);
  if (fclose(f)) {
    raplcap_perror(WARN, "get_physical_package_id: fclose");
  }
  if (fret != 1) {
    raplcap_log(ERROR, "get_physical_package_id: Failed to read physical_package_id for cpu%"PRIu32"\n", cpu);
    errno = ENODATA;
    return -1;
  }
  raplcap_log(DEBUG, "get_physical_package_id: cpu=%"PRIu32", pkg=%"PRIu32"\n", cpu, *pkg);
  return 0;
}